

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O1

int wave_add_generic(int pi,uint numPulses,gpioPulse_t *pulses)

{
  int iVar1;
  gpioExtent_t ext [1];
  
  if (numPulses != 0) {
    ext[0].size = (ulong)numPulses * 0xc;
    ext[0].ptr = pulses;
    iVar1 = pigpio_command_ext(pi,0x1c,0,0,(int)ext[0].size,1,ext,1);
    return iVar1;
  }
  return 0;
}

Assistant:

int wave_add_generic(int pi, unsigned numPulses, gpioPulse_t *pulses)
{
   gpioExtent_t ext[1];
   
   /*
   p1=0
   p2=0
   p3=pulses*sizeof(gpioPulse_t)
   ## extension ##
   gpioPulse_t[] pulses
   */

   if (!numPulses) return 0;

   ext[0].size = numPulses * sizeof(gpioPulse_t);
   ext[0].ptr = pulses;

   return pigpio_command_ext(
      pi, PI_CMD_WVAG, 0, 0, ext[0].size, 1, ext, 1);
}